

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,longlong v)

{
  _formatInteger<long_long>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<<(long long v)
{
	_formatInteger(v);
	return *this;
}